

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O1

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::rebucket_tuples(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                  *this,vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                        *tuples,comm *comm,size_t gl_offset,
                 vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                 *minqueries)

{
  ulong uVar1;
  anon_class_24_3_ecf550cb func;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  pointer pTVar5;
  ulong uVar6;
  size_t local_max;
  size_t prefix;
  size_t local_size;
  long local_58;
  long local_50;
  ulong local_48;
  long *local_40;
  long *plStack_38;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *local_30;
  
  local_48 = ((long)(tuples->
                    super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(tuples->
                    super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar3 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_48,comm);
  local_40 = &local_50;
  plStack_38 = &local_58;
  local_58 = 0;
  local_50 = gl_offset + uVar3;
  func.local_max = (size_t *)plStack_38;
  func.prefix = (size_t *)local_40;
  func.minqueries = minqueries;
  local_30 = minqueries;
  suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>::
  foreach_pair<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>::rebucket_tuples(std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>&,mxx::comm_const&,unsigned_long,std::vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>&)::_lambda(TwoBSA<unsigned_long>const&,TwoBSA<unsigned_long>&,unsigned_long)_1_>
            ((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
              *)this,(tuples->
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
             (tuples->
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
             _M_impl.super__Vector_impl_data._M_finish,func,comm);
  if ((comm->m_rank == 0) &&
     (((tuples->super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
       _M_impl.super__Vector_impl_data._M_start)->B1 = local_50 + 1, local_58 == 0)) {
    local_58 = local_50 + 1;
  }
  uVar3 = mxx::exscan<unsigned_long,mxx::max<unsigned_long>>(&local_58,comm);
  if (local_48 != 0) {
    uVar4 = 0;
    if (comm->m_rank == 0) {
      uVar3 = uVar4;
    }
    pTVar5 = (tuples->
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar2 = pTVar5->B1;
      if (pTVar5->B1 == 0) {
        pTVar5->B1 = uVar3;
        uVar2 = uVar3;
      }
      uVar3 = uVar2;
      uVar1 = pTVar5->B1;
      uVar6 = local_50 + uVar4 + 1;
      if (uVar6 < uVar1) {
        __assert_fail("tuples[i].B1 <= i+prefix+1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x4f4,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::rebucket_tuples(std::vector<TwoBSA<index_t>> &, const mxx::comm &, std::size_t, std::vector<std::tuple<index_t, index_t, index_t>> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      if (((uVar4 != 0) && (uVar6 != uVar1)) && (pTVar5[-1].B1 != uVar1)) {
        __assert_fail("i == 0 || (tuples[i-1].B1 == tuples[i].B1 || tuples[i].B1 == i+prefix+1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x4f6,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::rebucket_tuples(std::vector<TwoBSA<index_t>> &, const mxx::comm &, std::size_t, std::vector<std::tuple<index_t, index_t, index_t>> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      uVar4 = uVar4 + 1;
      pTVar5 = pTVar5 + 1;
    } while (uVar4 < local_48);
  }
  return;
}

Assistant:

void rebucket_tuples(std::vector<TwoBSA<index_t> >& tuples, const mxx::comm& comm, std::size_t gl_offset, std::vector<std::tuple<index_t, index_t, index_t> >& minqueries)
{
    /*
     * NOTE: buckets are indexed by the global index of the first element in
     *       the bucket with a ONE-BASED-INDEX (since bucket number `0` is
     *       reserved for out-of-bounds)
     */
    // inputs can be of different size, since buckets can span bucket boundaries
    std::size_t local_size = tuples.size();
    std::size_t prefix = mxx::exscan(local_size, std::plus<size_t>(), comm);
    size_t local_max = 0;
    prefix += gl_offset;

    // iterate through all pairs of elements (spanning across processors)
    foreach_pair(tuples.begin(), tuples.end(), [&](const TwoBSA<index_t>& prev, TwoBSA<index_t>& cur, size_t i){
        // if this is a new bucket boundary: set current to prefix+index and update LCP
        if (prev.B1 != cur.B1 || prev.B2 != cur.B2){
            // set every bucket boundary to its global index and other elements to
            // 0, a following max-scan will then distribute this bucket index among
            // its elements
            cur.B1 = prefix+i+1;
            local_max = cur.B1;
            if (_CONSTRUCT_LCP) {
                index_t left_b  = std::min(prev.B2, cur.B2);
                index_t right_b = std::max(prev.B2, cur.B2);
                // we need the minumum LCP of all suffixes in buckets between
                // these two buckets. Since the first element in the left bucket
                // is the LCP of this bucket with its left bucket and we don't need
                // this LCP value, start one to the right:
                // (-1 each since buffer numbers are current index + 1)
                index_t range_left = (left_b-1) + 1;
                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                minqueries.emplace_back(i + prefix, range_left, range_right);
            }
        } else {
            cur.B1 = 0;
        }
    }, comm);

    // specially handle first element of first process
    if (comm.rank() == 0) {
        tuples[0].B1 = prefix + 1;
        if (local_max == 0)
            local_max = prefix + 1;
    }

    /*
     * Global prefix MAX:
     *  - such that for every item we have it's bucket number, where the
     *    bucket number is equal to the first index in the bucket
     *    this way buckets who are finished, will never receive a new
     *    number.
     */
    // 2.) distributed scan with max() to get starting max for each sequence
    std::size_t pre_max = mxx::exscan(local_max, mxx::max<size_t>(), comm);
    if (comm.rank() == 0)
        pre_max = 0;

    // 3.) linear scan and assign bucket numbers
    for (std::size_t i = 0; i < local_size; ++i) {
        if (tuples[i].B1 == 0)
            tuples[i].B1 = pre_max;
        else
            pre_max = tuples[i].B1;
        assert(tuples[i].B1 <= i+prefix+1);
        // first element of bucket has id of it's own global index:
        assert(i == 0 || (tuples[i-1].B1 ==  tuples[i].B1 || tuples[i].B1 == i+prefix+1));
    }
}